

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Preferences::Node::add(Node *this,char *line)

{
  char **ppcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t b;
  size_t a;
  char **dst;
  char *line_local;
  Node *this_local;
  
  if ((-1 < lastEntrySet) && (lastEntrySet < this->nEntry_)) {
    ppcVar1 = &this->entry_[lastEntrySet].value;
    sVar2 = strlen(*ppcVar1);
    sVar3 = strlen(line);
    pcVar4 = (char *)realloc(*ppcVar1,sVar2 + sVar3 + 1);
    *ppcVar1 = pcVar4;
    memcpy(*ppcVar1 + sVar2,line,sVar3 + 1);
    this->field_0x30 = this->field_0x30 & 0xfe | 1;
  }
  return;
}

Assistant:

void Fl_Preferences::Node::add( const char *line ) {
  if ( lastEntrySet<0 || lastEntrySet>=nEntry_ ) return;
  char *&dst = entry_[ lastEntrySet ].value;
  size_t a = strlen( dst );
  size_t b = strlen( line );
  dst = (char*)realloc( dst, a+b+1 );
  memcpy( dst+a, line, b+1 );
  dirty_ = 1;
}